

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatch.c
# Opt level: O0

_Bool rtosc_match_number(char **pattern,char **msg)

{
  uint uVar1;
  uint uVar2;
  ushort **ppuVar3;
  long *in_RSI;
  long *in_RDI;
  uint val;
  uint max;
  _Bool local_1;
  
  ppuVar3 = __ctype_b_loc();
  if ((((*ppuVar3)[(int)*(char *)*in_RDI] & 0x800) == 0) ||
     (ppuVar3 = __ctype_b_loc(), ((*ppuVar3)[(int)*(char *)*in_RSI] & 0x800) == 0)) {
    local_1 = false;
  }
  else {
    uVar1 = atoi((char *)*in_RDI);
    uVar2 = atoi((char *)*in_RSI);
    while (ppuVar3 = __ctype_b_loc(), ((*ppuVar3)[(int)*(char *)*in_RDI] & 0x800) != 0) {
      *in_RDI = *in_RDI + 1;
    }
    while (ppuVar3 = __ctype_b_loc(), ((*ppuVar3)[(int)*(char *)*in_RSI] & 0x800) != 0) {
      *in_RSI = *in_RSI + 1;
    }
    local_1 = uVar2 < uVar1;
  }
  return local_1;
}

Assistant:

static bool rtosc_match_number(const char **pattern, const char **msg)
{
    //Verify both hold digits
    if(!isdigit(**pattern) || !isdigit(**msg))
        return false;

    //Read in both numeric values
    unsigned max = atoi(*pattern);
    unsigned val = atoi(*msg);

    ////Advance pointers
    while(isdigit(**pattern))++*pattern;
    while(isdigit(**msg))++*msg;

    //Match iff msg number is strictly less than pattern
    return val < max;
}